

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

void __thiscall minibag::TimePublisher::TimePublisher(TimePublisher *this)

{
  allocator<char> local_69;
  __shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2> local_68;
  element_type local_58 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  this->time_scale_ = 1.0;
  local_68._M_ptr = local_58;
  local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58[0] = (element_type)0x0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_48._M_impl._0_8_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  miniros::NodeHandle::NodeHandle(&this->node_handle_,(string *)&local_68,(map *)&local_48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  (this->wc_horizon_).super_TimeBase<miniros::WallTime,_miniros::WallDuration> =
       (TimeBase<miniros::WallTime,_miniros::WallDuration>)0x0;
  (this->horizon_).super_TimeBase<miniros::Time,_miniros::Duration> =
       (TimeBase<miniros::Time,_miniros::Duration>)0x0;
  (this->wall_step_).super_DurationBase<miniros::WallDuration> =
       (DurationBase<miniros::WallDuration>)0x0;
  (this->next_pub_).super_TimeBase<miniros::WallTime,_miniros::WallDuration> =
       (TimeBase<miniros::WallTime,_miniros::WallDuration>)0x0;
  (this->time_pub_).impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->time_pub_).impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->current_).super_TimeBase<miniros::Time,_miniros::Duration> =
       (TimeBase<miniros::Time,_miniros::Duration>)0x0;
  setPublishFrequency(this,-1.0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"clock",&local_69);
  miniros::NodeHandle::advertise<rosgraph_msgs::Clock_<std::allocator<void>>>
            ((NodeHandle *)&local_68,(string *)&this->node_handle_,(uint32_t)&local_48,true);
  std::__shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2> *)&this->time_pub_,
             &local_68);
  miniros::Publisher::~Publisher((Publisher *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

TimePublisher::TimePublisher() : time_scale_(1.0)
{
  setPublishFrequency(-1.0);
  time_pub_ = node_handle_.advertise<rosgraph_msgs::Clock>("clock",1);
}